

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  bool bVar1;
  Token *pTVar2;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *text_local;
  ParserImpl *this_local;
  
  local_20 = text;
  text_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_STRING);
  if (bVar1) {
    std::__cxx11::string::clear();
    while( true ) {
      bVar1 = LookingAtType(this,TYPE_STRING);
      if (!bVar1) break;
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      io::Tokenizer::ParseStringAppend(&pTVar2->text,local_20);
      io::Tokenizer::Next(&this->tokenizer_);
    }
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Expected string.",&local_41);
    ReportError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeString(string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError("Expected string.");
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }